

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O3

bool compare_files(char *pFilename1,char *pFilename2)

{
  int iVar1;
  FILE *__stream;
  FILE *__stream_00;
  ulong uVar2;
  ulong uVar3;
  void *__s;
  void *__s_00;
  size_t sVar4;
  char *pcVar5;
  value_type_conflict *__val_1;
  value_type_conflict *__val;
  bool bVar6;
  
  pcVar5 = pFilename2;
  __stream = (FILE *)open_file_with_retries(pFilename1,pFilename2);
  if (__stream == (FILE *)0x0) {
    print_error("Failed opening file: %s\n",pFilename1);
  }
  else {
    __stream_00 = (FILE *)open_file_with_retries(pFilename2,pcVar5);
    if (__stream_00 == (FILE *)0x0) {
      print_error("Failed opening file: %s\n",pFilename2);
    }
    else {
      fseek(__stream,0,2);
      uVar2 = ftello64(__stream);
      fseek(__stream,0,0);
      fseek(__stream_00,0,2);
      uVar3 = ftello64(__stream_00);
      fseek(__stream_00,0,0);
      if (uVar2 == uVar3) {
        __s = operator_new(0x100000);
        memset(__s,0,0x100000);
        __s_00 = operator_new(0x100000);
        memset(__s_00,0,0x100000);
        do {
          if (uVar2 == 0) {
            bVar6 = true;
LAB_00109028:
            fclose(__stream);
            fclose(__stream_00);
            operator_delete(__s_00,0x100000);
            operator_delete(__s,0x100000);
            return bVar6;
          }
          uVar3 = 0x100000;
          if ((long)uVar2 < 0x100000) {
            uVar3 = uVar2;
          }
          uVar3 = uVar3 & 0xffffffff;
          sVar4 = fread(__s,uVar3,1,__stream);
          pcVar5 = pFilename1;
          if ((sVar4 != 1) ||
             (sVar4 = fread(__s_00,uVar3,1,__stream_00), pcVar5 = pFilename2, sVar4 != 1)) {
            bVar6 = false;
            print_error("Failed reading from file: %s\n",pcVar5);
            goto LAB_00109028;
          }
          iVar1 = bcmp(__s,__s_00,uVar3);
          if (iVar1 != 0) {
            bVar6 = false;
            print_error("File data comparison failed!\n");
            goto LAB_00109028;
          }
          uVar2 = uVar2 - uVar3;
        } while( true );
      }
      print_error("Files to compare are not the same size: %I64i vs. %I64i.\n",uVar2,uVar3);
      fclose(__stream);
      __stream = __stream_00;
    }
    fclose(__stream);
  }
  return false;
}

Assistant:

static bool compare_files(const char *pFilename1, const char* pFilename2)
{
   FILE* pFile1 = open_file_with_retries(pFilename1, "rb");
   if (!pFile1)
   {
      print_error("Failed opening file: %s\n", pFilename1);
      return false;
   }

   FILE* pFile2 = open_file_with_retries(pFilename2, "rb");
   if (!pFile2)
   {
      print_error("Failed opening file: %s\n", pFilename2);
      fclose(pFile1);
      return false;
   }

   fseek(pFile1, 0, SEEK_END);
   int64 fileSize1 = _ftelli64(pFile1);
   fseek(pFile1, 0, SEEK_SET);

   fseek(pFile2, 0, SEEK_END);
   int64 fileSize2 = _ftelli64(pFile2);
   fseek(pFile2, 0, SEEK_SET);

   if (fileSize1 != fileSize2)
   {
      print_error("Files to compare are not the same size: %I64i vs. %I64i.\n", fileSize1, fileSize2);
      fclose(pFile1);
      fclose(pFile2);
      return false;
   }

   const uint cBufSize = 1024 * 1024;
   std::vector<uint8> buf1(cBufSize);
   std::vector<uint8> buf2(cBufSize);

   int64 bytes_remaining = fileSize1;
   while (bytes_remaining)
   {
      const uint bytes_to_read = static_cast<uint>(my_min(cBufSize, bytes_remaining));

      if (fread(&buf1.front(), bytes_to_read, 1, pFile1) != 1)
      {
         print_error("Failed reading from file: %s\n", pFilename1);
         fclose(pFile1);
         fclose(pFile2);
         return false;
      }

      if (fread(&buf2.front(), bytes_to_read, 1, pFile2) != 1)
      {
         print_error("Failed reading from file: %s\n", pFilename2);
         fclose(pFile1);
         fclose(pFile2);
         return false;
      }

      if (memcmp(&buf1.front(), &buf2.front(), bytes_to_read) != 0)
      {
         print_error("File data comparison failed!\n");
         fclose(pFile1);
         fclose(pFile2);
         return false;
      }

      bytes_remaining -= bytes_to_read;
   }

   fclose(pFile1);
   fclose(pFile2);
   return true;
}